

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O3

void Am_Stop_Interactor(Am_Object *inter,Am_Object *stop_obj,Am_Input_Char stop_char,
                       Am_Object *stop_window,int stop_x,int stop_y,bool update_now)

{
  bool bVar1;
  Am_Inter_State AVar2;
  Am_Wrapper *pAVar3;
  Am_Value *pAVar4;
  int stop_y_local;
  int stop_x_local;
  Am_Input_Char local_84;
  Am_Object local_80;
  Am_Inter_Internal_Method method;
  Am_Input_Event local_60;
  
  stop_y_local = stop_y;
  stop_x_local = stop_x;
  Am_Object::Am_Object(&local_80,inter);
  AVar2 = Am_Get_Inter_State(&local_80);
  Am_Object::~Am_Object(&local_80);
  if (AVar2 != Am_INTER_WAITING) {
    local_84 = stop_char;
    bVar1 = Am_Object::Valid(stop_obj);
    if (bVar1) {
      pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(stop_obj);
      Am_Object::Set(inter,0x119,pAVar3,0);
    }
    else {
      pAVar4 = Am_Object::Get(inter,0x119,0);
      Am_Object::operator=(stop_obj,pAVar4);
    }
    bVar1 = Am_Object::Valid(stop_obj);
    if ((bVar1) && (bVar1 = Am_Object::Valid(stop_window), !bVar1)) {
      pAVar4 = Am_Object::Get(stop_obj,0x68,0);
      Am_Object::operator=(stop_window,pAVar4);
      bVar1 = Am_Object::Valid(stop_window);
      if ((!bVar1) ||
         (bVar1 = Am_Translate_Coordinates(stop_obj,0,0,stop_window,&stop_x_local,&stop_y_local),
         !bVar1)) {
        pAVar4 = Am_Object::Get(stop_obj,100,0);
        stop_x_local = Am_Value::operator_cast_to_int(pAVar4);
        pAVar4 = Am_Object::Get(stop_obj,0x65,0);
        stop_y_local = Am_Value::operator_cast_to_int(pAVar4);
      }
    }
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(stop_window);
    Am_Object::Set(inter,0x68,pAVar3,0);
    Am_Input_Char::Am_Input_Char
              (&local_60.input_char,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
    local_60.user_id.type = 0;
    local_60.user_id.value.wrapper_value = (Am_Wrapper *)0x0;
    local_60.input_char.code = local_84.code;
    local_60.input_char._2_2_ = stop_char._2_2_ & 0xfff | local_60.input_char._2_2_ & 0xf000;
    local_60.x = stop_x_local;
    local_60.y = stop_y_local;
    local_60.draw = (Am_Drawonable *)0x0;
    local_60.time_stamp = 0;
    method.from_wrapper = (Am_Method_Wrapper *)0x0;
    method.Call = (Am_Inter_Internal_Method_Type *)0x0;
    pAVar4 = Am_Object::Get(inter,0xc2,0);
    Am_Inter_Internal_Method::operator=(&method,pAVar4);
    (*method.Call)(inter,stop_obj,stop_window,&local_60);
    if (update_now) {
      Am_Demon_Queue::Invoke(&Main_Demon_Queue);
      Am_Update_All();
    }
    Am_Value::~Am_Value(&local_60.user_id);
    return;
  }
  return;
}

Assistant:

void
Am_Stop_Interactor(Am_Object inter, Am_Object stop_obj, Am_Input_Char stop_char,
                   Am_Object stop_window, int stop_x, int stop_y,
                   bool update_now)
{

  Am_Inter_State state = Am_Get_Inter_State(inter);

  if (state == Am_INTER_WAITING) {
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SHORT, "Explicitly stopping Interactor "
                                                   << inter
                                                   << " but it is not running");
    return;
  }

  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SHORT, "Explicitly Stopping " << inter);
  if (!stop_obj.Valid())
    stop_obj = inter.Get(Am_CURRENT_OBJECT);
  else
    inter.Set(Am_CURRENT_OBJECT, stop_obj);
  if (stop_obj.Valid()) {
    if (!stop_window.Valid()) {
      stop_window = stop_obj.Get(Am_WINDOW);
      if (stop_window.Valid() &&
          Am_Translate_Coordinates(stop_obj, 0, 0, stop_window, stop_x, stop_y))
        //then have pos of start_obj in start_window
        ;
      else {
        stop_x = stop_obj.Get(Am_LEFT);
        stop_y = stop_obj.Get(Am_TOP);
      }
    }
  }
  //now stop the interactor
  inter.Set(Am_WINDOW, stop_window);
  Am_Input_Event ev;
  ev.input_char = stop_char;
  ev.x = stop_x;
  ev.y = stop_y;
  ev.draw = nullptr;
  ev.time_stamp = 0;
  Am_Inter_Internal_Method method;
  method = inter.Get(Am_INTER_STOP_METHOD);
  method.Call(inter, stop_obj, stop_window, &ev);
  if (update_now)
    do_update();
}